

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O2

ssize_t __thiscall
wasm::LEB<unsigned_long,_unsigned_char>::write
          (LEB<unsigned_long,_unsigned_char> *this,int __fd,void *__buf,size_t __n)

{
  ulong in_RAX;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ulong uVar1;
  undefined8 uStack_28;
  uint8_t byte;
  
  uStack_28 = in_RAX;
  for (uVar1 = this->value;
      uStack_28 = CONCAT17((char)uVar1,(undefined7)uStack_28) & 0x7fffffffffffffff, 0x7f < uVar1;
      uVar1 = uVar1 >> 7) {
    uStack_28 = CONCAT17((char)uVar1,(undefined7)uStack_28) | 0x8000000000000000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_register_00000034,__fd),(value_type_conflict1 *)((long)&uStack_28 + 7));
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_register_00000034,__fd),(value_type_conflict1 *)((long)&uStack_28 + 7));
  return extraout_RAX;
}

Assistant:

void write(std::vector<uint8_t>* out) {
    T temp = value;
    bool more;
    do {
      uint8_t byte = temp & 127;
      temp >>= 7;
      more = hasMore(temp, byte);
      if (more) {
        byte = byte | 128;
      }
      out->push_back(byte);
    } while (more);
  }